

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QRhiColorAttachment>::append_impl
          (QVLABase<QRhiColorAttachment> *this,qsizetype prealloc,void *array,
          QRhiColorAttachment *abuf,qsizetype increment)

{
  size_type sVar1;
  QVLABase<QRhiColorAttachment> *in_RCX;
  QRhiColorAttachment *in_RDI;
  QRhiColorAttachment *in_R8;
  qsizetype asize;
  QRhiRenderBuffer *increment_00;
  QRhiRenderBuffer *prealloc_00;
  
  if (0 < (long)in_R8) {
    sVar1 = QVLABaseBase::size((QVLABaseBase *)in_RDI);
    increment_00 = (QRhiRenderBuffer *)((long)&((QVLABaseBase *)&in_R8->m_texture)->a + sVar1);
    prealloc_00 = increment_00;
    sVar1 = QVLABaseBase::capacity((QVLABaseBase *)in_RDI);
    if (sVar1 <= (long)increment_00) {
      growBy((QVLABase<QRhiColorAttachment> *)in_R8,(qsizetype)prealloc_00,in_RDI,
             (qsizetype)increment_00);
    }
    end(in_RCX);
    std::uninitialized_copy_n<QRhiColorAttachment_const*,long_long,QRhiColorAttachment*>
              (in_R8,(longlong)prealloc_00,in_RDI);
    in_RDI->m_renderBuffer = prealloc_00;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::append_impl(qsizetype prealloc, void *array, const T *abuf, qsizetype increment)
{
    Q_ASSERT(abuf || increment == 0);
    if (increment <= 0)
        return;

    const qsizetype asize = size() + increment;

    if (asize >= capacity())
        growBy(prealloc, array, increment);

    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_copy_n(abuf, increment, end());
    else
        memcpy(static_cast<void *>(end()), static_cast<const void *>(abuf), increment * sizeof(T));

    this->s = asize;
}